

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O3

_Bool gpu_init_SDL(void)

{
  int iVar1;
  
  if (_gpu_initialized_SDL != '\0') {
    return true;
  }
  if ((_gpu_initialized_SDL_core == '\0') && (iVar1 = SDL_WasInit(0xf231), iVar1 == 0)) {
    iVar1 = SDL_Init(0x20);
    if (iVar1 < 0) goto LAB_0015cb2a;
    _gpu_initialized_SDL_core = '\x01';
  }
  iVar1 = SDL_InitSubSystem(0x20);
  if (-1 < iVar1) {
    _gpu_initialized_SDL = 1;
    return true;
  }
LAB_0015cb2a:
  GPU_PushErrorCode("GPU_Init",GPU_ERROR_BACKEND_ERROR,"Failed to initialize SDL video subsystem");
  return false;
}

Assistant:

static GPU_bool gpu_init_SDL(void)
{
    if(!_gpu_initialized_SDL)
    {
        if(!_gpu_initialized_SDL_core && !SDL_WasInit(SDL_INIT_EVERYTHING))
        {
            // Nothing has been set up, so init SDL and the video subsystem.
            if(SDL_Init(SDL_INIT_VIDEO) < 0)
            {
                GPU_PushErrorCode("GPU_Init", GPU_ERROR_BACKEND_ERROR, "Failed to initialize SDL video subsystem");
                return GPU_FALSE;
            }
            _gpu_initialized_SDL_core = GPU_TRUE;
        }

        // SDL is definitely ready now, but we're going to init the video subsystem to be sure that SDL_gpu keeps it available until GPU_Quit().
        if(SDL_InitSubSystem(SDL_INIT_VIDEO) < 0)
        {
            GPU_PushErrorCode("GPU_Init", GPU_ERROR_BACKEND_ERROR, "Failed to initialize SDL video subsystem");
            return GPU_FALSE;
        }
        _gpu_initialized_SDL = GPU_TRUE;
    }
    return GPU_TRUE;
}